

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O1

void __thiscall
SQCompilation::CodegenVisitor::visitLiteralExpr(CodegenVisitor *this,LiteralExpr *lit)

{
  SQFuncState *this_00;
  SQObject SVar1;
  unkbyte10 Var2;
  SQInteger SVar3;
  SQInteger SVar4;
  anon_union_4_2_91d81cc7_for_SQInstruction_0 *i;
  SQFuncState *this_01;
  SQObject local_38;
  anon_union_4_2_91d81cc7_for_SQInstruction_0 local_28;
  undefined1 local_24;
  undefined1 local_23;
  
  i = (anon_union_4_2_91d81cc7_for_SQInstruction_0 *)&local_38;
  maybeAddInExprLine(this,(Expr *)lit);
  switch(lit->_kind) {
  case LK_STRING:
    this_01 = this->_fs;
    SVar4 = SQFuncState::PushTarget(this_01,-1);
    this_00 = this->_fs;
    local_38 = SQFuncState::CreateString(this_00,(lit->_v).s,-1);
    SVar3 = SQFuncState::GetConstant(this_00,&local_38,0x7fffffff);
    i = &local_28;
    local_24 = 1;
    local_23 = (undefined1)SVar4;
    local_28._arg1 = (SQInt32)SVar3;
    break;
  case LK_INT:
    EmitLoadConstInt(this,(lit->_v).i,-1);
    return;
  case LK_FLOAT:
    EmitLoadConstFloat(this,(lit->_v).f,-1);
    return;
  case LK_BOOL:
    this_01 = this->_fs;
    SVar4 = SQFuncState::PushTarget(this_01,-1);
    local_38._5_1_ = (char)SVar4;
    local_38._type = 0;
    local_38._flags = ' ';
    local_38._type = (uint)(lit->_v).b;
    break;
  case LK_NULL:
    this_01 = this->_fs;
    SVar4 = SQFuncState::PushTarget(this_01,-1);
    Var2 = local_38._6_10_;
    local_38._5_1_ = (char)SVar4;
    local_38._type = 0;
    local_38._flags = '\x1e';
    local_38._type = 1;
    SVar1 = local_38;
    local_38._unVal.nInteger = SUB108(Var2,2);
    local_38._0_6_ = SVar1._0_6_;
    local_38._6_2_ = 0;
    i = (anon_union_4_2_91d81cc7_for_SQInstruction_0 *)&local_38;
    goto LAB_0016b06b;
  default:
    goto switchD_0016af9b_default;
  }
  *(undefined2 *)((long)i + 6) = 0;
LAB_0016b06b:
  SQFuncState::AddInstruction(this_01,(SQInstruction *)i);
switchD_0016af9b_default:
  return;
}

Assistant:

void CodegenVisitor::visitLiteralExpr(LiteralExpr *lit) {
    maybeAddInExprLine(lit);
    switch (lit->kind()) {
    case LK_STRING:
        _fs->AddInstruction(_OP_LOAD, _fs->PushTarget(), _fs->GetConstant(_fs->CreateString(lit->s())));
        break;
    case LK_FLOAT:EmitLoadConstFloat(lit->f(), -1); break;
    case LK_INT:  EmitLoadConstInt(lit->i(), -1); break;
    case LK_BOOL: _fs->AddInstruction(_OP_LOADBOOL, _fs->PushTarget(), lit->b()); break;
    case LK_NULL: _fs->AddInstruction(_OP_LOADNULLS, _fs->PushTarget(), 1); break;
    }
}